

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

bool __thiscall
prometheus::detail::MetricsHandler::handleGet
          (MetricsHandler *this,CivetServer *param_1,mg_connection *conn)

{
  Summary *this_00;
  size_t sVar1;
  rep rVar2;
  undefined1 auVar3 [16];
  duration<long,_std::ratio<1L,_1000000000L>_> local_b8;
  duration<long,_std::ratio<1L,_1000000L>_> local_b0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop_time_of_request;
  size_t bodySize;
  TextSerializer serializer;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  time_point start_time_of_request;
  mg_connection *conn_local;
  CivetServer *param_1_local;
  MetricsHandler *this_local;
  
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::steady_clock::now()
  ;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&this->collectables_mutex_);
  CollectMetrics((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 &serializer,&this->collectables_);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::operator=
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&lock,
             (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &serializer);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &serializer);
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  TextSerializer::TextSerializer((TextSerializer *)&bodySize);
  Serializer::Serialize_abi_cxx11_
            ((string *)&stop_time_of_request,(Serializer *)&bodySize,
             (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&lock);
  sVar1 = WriteResponse(conn,(string *)&stop_time_of_request);
  std::__cxx11::string::~string((string *)&stop_time_of_request);
  duration.__r = std::chrono::_V2::steady_clock::now();
  local_b8.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&metrics.
                                     super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b0.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_b8);
  this_00 = this->request_latencies_;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_b0);
  Summary::Observe(this_00,(double)rVar2);
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  Counter::Increment(this->bytes_transferred_,
                     (auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  Counter::Increment(this->num_scrapes_);
  TextSerializer::~TextSerializer((TextSerializer *)&bodySize);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&lock);
  return true;
}

Assistant:

bool MetricsHandler::handleGet(CivetServer*, struct mg_connection* conn) {
  auto start_time_of_request = std::chrono::steady_clock::now();

  std::vector<MetricFamily> metrics;

  {
    std::lock_guard<std::mutex> lock{collectables_mutex_};
    metrics = CollectMetrics(collectables_);
  }

  const TextSerializer serializer;

  auto bodySize = WriteResponse(conn, serializer.Serialize(metrics));

  auto stop_time_of_request = std::chrono::steady_clock::now();
  auto duration = std::chrono::duration_cast<std::chrono::microseconds>(
      stop_time_of_request - start_time_of_request);
  request_latencies_.Observe(duration.count());

  bytes_transferred_.Increment(bodySize);
  num_scrapes_.Increment();
  return true;
}